

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_key_pem(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  mbedtls_pk_type_t mVar1;
  size_t local_1680;
  size_t olen;
  char *end;
  char *begin;
  uchar output_buf [5679];
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  local_1680 = 0;
  key_local._4_4_ = mbedtls_pk_write_key_der(key,(uchar *)&begin,0x162f);
  if (-1 < key_local._4_4_) {
    mVar1 = mbedtls_pk_get_type(key);
    if (mVar1 == MBEDTLS_PK_RSA) {
      end = "-----BEGIN RSA PRIVATE KEY-----\n";
      olen = (size_t)anon_var_dwarf_30f3;
    }
    else {
      mVar1 = mbedtls_pk_get_type(key);
      if (mVar1 != MBEDTLS_PK_ECKEY) {
        return -0x3980;
      }
      end = "-----BEGIN EC PRIVATE KEY-----\n";
      olen = (size_t)anon_var_dwarf_3121;
    }
    key_local._4_4_ =
         mbedtls_pem_write_buffer
                   (end,(char *)olen,output_buf + (0x1627 - (long)key_local._4_4_),
                    (long)key_local._4_4_,buf,size,&local_1680);
    if (key_local._4_4_ == 0) {
      key_local._4_4_ = 0;
    }
  }
  return key_local._4_4_;
}

Assistant:

int mbedtls_pk_write_key_pem( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char output_buf[PRV_DER_MAX_BYTES];
    const char *begin, *end;
    size_t olen = 0;

    if( ( ret = mbedtls_pk_write_key_der( key, output_buf, sizeof(output_buf) ) ) < 0 )
        return( ret );

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        begin = PEM_BEGIN_PRIVATE_KEY_RSA;
        end = PEM_END_PRIVATE_KEY_RSA;
    }
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        begin = PEM_BEGIN_PRIVATE_KEY_EC;
        end = PEM_END_PRIVATE_KEY_EC;
    }
    else
#endif
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    if( ( ret = mbedtls_pem_write_buffer( begin, end,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}